

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_pose.h
# Opt level: O0

void __thiscall sfm::CameraPose::fill_p_matrix(CameraPose *this,Matrix<double,_3,_4> *P)

{
  double *values;
  Matrix<double,_3,_4> local_f0;
  Vector<double,_3> local_90;
  undefined1 local_78 [8];
  Matrix<double,_3,_1> Kt;
  Matrix<double,_3,_3> KR;
  Matrix<double,_3,_4> *P_local;
  CameraPose *this_local;
  
  math::Matrix<double,3,3>::operator*
            ((Matrix<double,_3,_3> *)(Kt.m + 2),(Matrix<double,3,3> *)this,&this->R);
  math::Matrix<double,_3,_3>::operator*(&local_90,&this->K,&this->t);
  values = math::Vector<double,_3>::operator*(&local_90);
  math::Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)local_78,values);
  math::Matrix<double,_3,_3>::hstack<1>
            (&local_f0,(Matrix<double,_3,_3> *)(Kt.m + 2),(Matrix<double,_3,_1> *)local_78);
  math::Matrix<double,_3,_4>::operator=(P,&local_f0);
  return;
}

Assistant:

inline void
CameraPose::fill_p_matrix (math::Matrix<double, 3, 4>* P) const
{
    math::Matrix<double, 3, 3> KR = this->K * this->R;
    math::Matrix<double, 3, 1> Kt(*(this->K * this->t));
    *P = KR.hstack(Kt);
}